

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall
S2Polygon::InsertLoop(S2Polygon *this,S2Loop *new_loop,S2Loop *parent,LoopMap *loop_map)

{
  pointer ppSVar1;
  S2Loop *this_00;
  bool bVar2;
  mapped_type *this_01;
  mapped_type *unaff_RBX;
  vector<S2Loop_*,_std::allocator<S2Loop_*>_> *__range2;
  int i;
  int iVar3;
  pointer ppSVar4;
  ulong uVar5;
  bool bVar6;
  S2Loop *child;
  S2Loop *local_50;
  map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
  *local_48;
  S2Loop *local_40;
  S2Loop *local_38;
  
  bVar6 = false;
  local_50 = new_loop;
  local_48 = loop_map;
  this_00 = parent;
  do {
    local_40 = this_00;
    if (bVar6) {
      this_01 = std::
                map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
                ::operator[](local_48,&local_50);
      iVar3 = 0;
      while( true ) {
        uVar5 = (ulong)iVar3;
        ppSVar4 = (unaff_RBX->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(unaff_RBX->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3) <= uVar5)
        break;
        local_38 = ppSVar4[uVar5];
        bVar6 = S2Loop::ContainsNested(local_50,local_38);
        if (bVar6) {
          std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::push_back(this_01,&local_38);
          std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::erase
                    (unaff_RBX,
                     (const_iterator)
                     ((unaff_RBX->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar5));
        }
        else {
          iVar3 = iVar3 + 1;
        }
      }
      std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::push_back(unaff_RBX,&local_50);
      return;
    }
    unaff_RBX = std::
                map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
                ::operator[](local_48,&local_40);
    ppSVar4 = (unaff_RBX->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar1 = (unaff_RBX->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      bVar6 = ppSVar4 == ppSVar1;
      this_00 = local_40;
      if (bVar6) break;
      this_00 = *ppSVar4;
      bVar2 = S2Loop::ContainsNested(this_00,new_loop);
      ppSVar4 = ppSVar4 + 1;
    } while (!bVar2);
  } while( true );
}

Assistant:

void S2Polygon::InsertLoop(S2Loop* new_loop, S2Loop* parent,
                           LoopMap* loop_map) {
  vector<S2Loop*>* children;
  for (bool done = false; !done; ) {
    children = &(*loop_map)[parent];
    done = true;
    for (S2Loop* child : *children) {
      if (child->ContainsNested(new_loop)) {
        parent = child;
        done = false;
        break;
      }
    }
  }

  // Some of the children of the parent loop may now be children of
  // the new loop.
  vector<S2Loop*>* new_children = &(*loop_map)[new_loop];
  for (int i = 0; i < children->size();) {
    S2Loop* child = (*children)[i];
    if (new_loop->ContainsNested(child)) {
      new_children->push_back(child);
      children->erase(children->begin() + i);
    } else {
      ++i;
    }
  }
  children->push_back(new_loop);
}